

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_adjoin_maxtrix.h
# Opt level: O3

void __thiscall adjMaxtrix<char>::BroadFirstSearch(adjMaxtrix<char> *this,_func_void_char *Visit)

{
  int *visited;
  long lVar1;
  pointer pcVar2;
  ulong uVar3;
  pointer pcVar4;
  
  pcVar4 = (this->vexs).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar2 = (this->vexs).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  visited = (int *)operator_new__(-(ulong)((ulong)((long)pcVar2 - (long)pcVar4) >> 0x3e != 0) |
                                  ((long)pcVar2 - (long)pcVar4) * 4);
  lVar1 = (long)pcVar2 - (long)pcVar4;
  if (lVar1 != 0) {
    uVar3 = 0;
    memset(visited,0,(lVar1 + (ulong)(lVar1 == 0)) * 4);
    do {
      if (visited[uVar3] == 0) {
        BFS(this,(int)uVar3,visited,Visit);
        pcVar4 = (this->vexs).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pcVar2 = (this->vexs).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < (ulong)((long)pcVar2 - (long)pcVar4));
  }
  operator_delete__(visited);
  return;
}

Assistant:

void adjMaxtrix<dataType>::BroadFirstSearch(void Visit(dataType item)) {
	int i;
	int *visited = new int[vexs.size()];
	for (i = 0; i < vexs.size(); i++)
		visited[i] = 0;
	for (i = 0; i < vexs.size(); i++)
		if (!visited[i])
			BFS(i, visited, Visit);
	delete[] visited;
}